

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O0

RenderContext *
glu::createDefaultRenderContext(Platform *platform,CommandLine *cmdLine,ApiType apiType)

{
  char *pcVar1;
  RenderContext *pRVar2;
  ApiType local_98 [5];
  allocator<char> local_81;
  string local_80;
  ContextFlags local_60;
  ContextType local_5c;
  ContextFlags ctxFlags;
  RenderConfig config;
  CommandLine *cmdLine_local;
  Platform *platform_local;
  ApiType apiType_local;
  
  config._48_8_ = cmdLine;
  ContextType::ContextType(&local_5c);
  RenderConfig::RenderConfig((RenderConfig *)&ctxFlags,local_5c);
  local_60 = 0;
  pcVar1 = tcu::CommandLine::getGLContextFlags((CommandLine *)config._48_8_);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = tcu::CommandLine::getGLContextFlags((CommandLine *)config._48_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar1,&local_81);
    local_60 = parseContextFlags(&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  ContextType::ContextType((ContextType *)local_98,apiType,local_60);
  ctxFlags = local_98[0].m_bits;
  parseRenderConfig((RenderConfig *)&ctxFlags,(CommandLine *)config._48_8_);
  pRVar2 = createRenderContext(platform,(CommandLine *)config._48_8_,(RenderConfig *)&ctxFlags);
  return pRVar2;
}

Assistant:

RenderContext* createDefaultRenderContext (tcu::Platform& platform, const tcu::CommandLine& cmdLine, ApiType apiType)
{
	RenderConfig	config;
	ContextFlags	ctxFlags	= ContextFlags(0);

	if (cmdLine.getGLContextFlags())
		ctxFlags = parseContextFlags(cmdLine.getGLContextFlags());

	config.type = glu::ContextType(apiType, ctxFlags);
	parseRenderConfig(&config, cmdLine);

	return createRenderContext(platform, cmdLine, config);
}